

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O1

PTree * p_tree_new_full(PTreeType type,PCompareDataFunc func,ppointer data,PDestroyFunc key_destroy,
                       PDestroyFunc value_destroy)

{
  PTree *pPVar1;
  code *pcVar2;
  
  pPVar1 = (PTree *)0x0;
  if ((type < (P_TREE_TYPE_AVL|P_TREE_TYPE_RB)) && (func != (PCompareDataFunc)0x0)) {
    pPVar1 = (PTree *)p_malloc0(0x48);
    if (pPVar1 == (PTree *)0x0) {
      pPVar1 = (PTree *)0x0;
      printf("** Error: %s **\n","PTree::p_tree_new_full: failed to allocate memory");
    }
    else {
      pPVar1->type = type;
      pPVar1->compare_func = func;
      pPVar1->data = data;
      pPVar1->key_destroy_func = key_destroy;
      pPVar1->value_destroy_func = value_destroy;
      if (type == P_TREE_TYPE_AVL) {
        pPVar1->insert_node_func = p_tree_avl_insert;
        pPVar1->remove_node_func = p_tree_avl_remove;
        pcVar2 = p_tree_avl_node_free;
      }
      else if (type == P_TREE_TYPE_RB) {
        pPVar1->insert_node_func = p_tree_rb_insert;
        pPVar1->remove_node_func = p_tree_rb_remove;
        pcVar2 = p_tree_rb_node_free;
      }
      else {
        if (type != P_TREE_TYPE_BINARY) {
          return pPVar1;
        }
        pPVar1->insert_node_func = p_tree_bst_insert;
        pPVar1->remove_node_func = p_tree_bst_remove;
        pcVar2 = p_tree_bst_node_free;
      }
      pPVar1->free_node_func = pcVar2;
    }
  }
  return pPVar1;
}

Assistant:

P_LIB_API PTree *
p_tree_new_full (PTreeType		type,
		 PCompareDataFunc	func,
		 ppointer		data,
		 PDestroyFunc		key_destroy,
		 PDestroyFunc		value_destroy)
{
	PTree *ret;

	if (P_UNLIKELY (!((int) type >= (int) P_TREE_TYPE_BINARY &&
			  (int) type <= (int) P_TREE_TYPE_AVL)))
		return NULL;

	if (P_UNLIKELY (func == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PTree))) == NULL)) {
		P_ERROR ("PTree::p_tree_new_full: failed to allocate memory");
		return NULL;
	}

	ret->type               = type;
	ret->compare_func       = func;
	ret->data               = data;
	ret->key_destroy_func   = key_destroy;
	ret->value_destroy_func	= value_destroy;

	switch (type) {
	case P_TREE_TYPE_BINARY:
		ret->insert_node_func = p_tree_bst_insert;
		ret->remove_node_func = p_tree_bst_remove;
		ret->free_node_func   = p_tree_bst_node_free;
		break;
	case P_TREE_TYPE_RB:
		ret->insert_node_func = p_tree_rb_insert;
		ret->remove_node_func = p_tree_rb_remove;
		ret->free_node_func   = p_tree_rb_node_free;
		break;
	case P_TREE_TYPE_AVL:
		ret->insert_node_func = p_tree_avl_insert;
		ret->remove_node_func = p_tree_avl_remove;
		ret->free_node_func   = p_tree_avl_node_free;
		break;
	}

	return ret;
}